

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

Reference * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::ReadReference_abi_cxx11_
          (Reference *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
          *this)

{
  BinaryReaderBase *this_00;
  char *pcVar1;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  local_18.field_1.values_ = (Value *)&local_28;
  this_00 = *(BinaryReaderBase **)this;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  if (*pcVar1 == 'v') {
    DoReadReference_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  local_28 = 0;
  uStack_20 = 0;
  local_18.types_ = 0;
  BinaryReaderBase::ReportError(this_00,(CStringRef)0x2620c3,&local_18);
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }